

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

int token_to_int(IncludeState *state)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  undefined8 uStack_20;
  char *local_18;
  char *buf;
  IncludeState *state_local;
  
  buf = (char *)state;
  if (state->tokenval == TOKEN_INT_LITERAL) {
    lVar3 = -((ulong)(state->tokenlen + 1) + 0xf & 0xfffffffffffffff0);
    pcVar2 = state->token;
    uVar1 = state->tokenlen;
    local_18 = (char *)((long)&local_18 + lVar3);
    *(undefined8 *)((long)&uStack_20 + lVar3) = 0x151954;
    memcpy((char *)((long)&local_18 + lVar3),pcVar2,(ulong)uVar1);
    pcVar2 = local_18;
    local_18[*(uint *)(buf + 0x20)] = '\0';
    *(undefined8 *)((long)&uStack_20 + lVar3) = 0x15196c;
    iVar4 = atoi(pcVar2);
    return iVar4;
  }
  uStack_20 = 0x15191a;
  __assert_fail("state->tokenval == TOKEN_INT_LITERAL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x2ef,"int token_to_int(IncludeState *)");
}

Assistant:

static int token_to_int(IncludeState *state)
{
    assert(state->tokenval == TOKEN_INT_LITERAL);
    char *buf = (char *) alloca(state->tokenlen+1);
    memcpy(buf, state->token, state->tokenlen);
    buf[state->tokenlen] = '\0';
    return atoi(buf);
}